

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListTest_emplace_back_Test::IntrusiveListTest_emplace_back_Test
          (IntrusiveListTest_emplace_back_Test *this)

{
  anon_unknown.dwarf_633d3::IntrusiveListTest::IntrusiveListTest(&this->super_IntrusiveListTest);
  (this->super_IntrusiveListTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_002dd520;
  return;
}

Assistant:

TEST_F(IntrusiveListTest, emplace_back) {
  TestObjectList list;

  // Pass an additional arg to show that forwarding works properly.
  list.emplace_back(1, 100);
  list.emplace_back(2, 200);
  list.emplace_back(3, 300);
  list.emplace_back(4, 400);

  AssertListEq(list, {1, 2, 3, 4}, {100, 200, 300, 400});
}